

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O1

void __thiscall
moodycamel::ConcurrentQueue<_zframe_t_*,_MyTraits>::ExplicitProducer::~ExplicitProducer
          (ExplicitProducer *this)

{
  FreeList<moodycamel::ConcurrentQueue<_zframe_t_*,_MyTraits>::Block> *pFVar1;
  atomic<unsigned_int> *paVar2;
  __int_type_conflict1 _Var3;
  Block *pBVar4;
  ConcurrentQueue<_zframe_t_*,_MyTraits> *pCVar5;
  void *pvVar6;
  void *__ptr;
  Block *pBVar7;
  __pointer_type pBVar8;
  __pointer_type pBVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  
  (this->super_ProducerBase)._vptr_ProducerBase = (_func_int **)&PTR__ExplicitProducer_003edbc0;
  pBVar7 = (this->super_ProducerBase).tailBlock;
  if (pBVar7 != (Block *)0x0) {
    if ((char)(this->super_ProducerBase).headIndex.super___atomic_base<unsigned_long>._M_i != '\0')
    {
      uVar10 = this->pr_blockIndexFront - this->pr_blockIndexSlotsUsed;
      do {
        uVar11 = uVar10 & this->pr_blockIndexSize - 1;
        uVar10 = uVar11 + 1;
      } while (0x8000000000000000 <
               (this->pr_blockIndexEntries[uVar11].base -
               (this->super_ProducerBase).headIndex.super___atomic_base<unsigned_long>._M_i) + 0x100
              );
    }
    do {
      pBVar7 = pBVar7->next;
    } while (pBVar7 != (this->super_ProducerBase).tailBlock);
  }
  pBVar7 = (this->super_ProducerBase).tailBlock;
  if (pBVar7 != (Block *)0x0) {
    do {
      pBVar4 = pBVar7->next;
      if (pBVar7->dynamicallyAllocated == true) {
        free(pBVar7);
      }
      else {
        pCVar5 = (this->super_ProducerBase).parent;
        LOCK();
        paVar2 = &pBVar7->freeListRefs;
        _Var3 = (paVar2->super___atomic_base<unsigned_int>)._M_i;
        (paVar2->super___atomic_base<unsigned_int>)._M_i =
             (paVar2->super___atomic_base<unsigned_int>)._M_i + 0x80000000;
        UNLOCK();
        if (_Var3 == 0) {
          pBVar8 = (pCVar5->freeList).freeListHead._M_b._M_p;
          do {
            (pBVar7->freeListNext)._M_b._M_p = pBVar8;
            (pBVar7->freeListRefs).super___atomic_base<unsigned_int>._M_i = 1;
            pFVar1 = &pCVar5->freeList;
            LOCK();
            pBVar9 = (pFVar1->freeListHead)._M_b._M_p;
            bVar12 = pBVar8 == pBVar9;
            if (bVar12) {
              (pFVar1->freeListHead)._M_b._M_p = pBVar7;
              pBVar9 = pBVar8;
            }
            UNLOCK();
            if (bVar12) break;
            LOCK();
            paVar2 = &pBVar7->freeListRefs;
            _Var3 = (paVar2->super___atomic_base<unsigned_int>)._M_i;
            (paVar2->super___atomic_base<unsigned_int>)._M_i =
                 (paVar2->super___atomic_base<unsigned_int>)._M_i + 0x7fffffff;
            UNLOCK();
            pBVar8 = pBVar9;
          } while (_Var3 == 1);
        }
      }
      pBVar7 = pBVar4;
    } while (pBVar4 != (this->super_ProducerBase).tailBlock);
  }
  __ptr = this->pr_blockIndexRaw;
  while (__ptr != (void *)0x0) {
    pvVar6 = *(void **)((long)__ptr + 0x18);
    free(__ptr);
    __ptr = pvVar6;
  }
  return;
}

Assistant:

~ExplicitProducer()
		{
			// Destruct any elements not yet dequeued.
			// Since we're in the destructor, we can assume all elements
			// are either completely dequeued or completely not (no halfways).
			if (this->tailBlock != nullptr) {		// Note this means there must be a block index too
				// First find the block that's partially dequeued, if any
				Block* halfDequeuedBlock = nullptr;
				if ((this->headIndex.load(std::memory_order_relaxed) & static_cast<index_t>(BLOCK_SIZE - 1)) != 0) {
					// The head's not on a block boundary, meaning a block somewhere is partially dequeued
					// (or the head block is the tail block and was fully dequeued, but the head/tail are still not on a boundary)
					size_t i = (pr_blockIndexFront - pr_blockIndexSlotsUsed) & (pr_blockIndexSize - 1);
					while (details::circular_less_than<index_t>(pr_blockIndexEntries[i].base + BLOCK_SIZE, this->headIndex.load(std::memory_order_relaxed))) {
						i = (i + 1) & (pr_blockIndexSize - 1);
					}
					assert(details::circular_less_than<index_t>(pr_blockIndexEntries[i].base, this->headIndex.load(std::memory_order_relaxed)));
					halfDequeuedBlock = pr_blockIndexEntries[i].block;
				}
				
				// Start at the head block (note the first line in the loop gives us the head from the tail on the first iteration)
				auto block = this->tailBlock;
				do {
					block = block->next;
					if (block->ConcurrentQueue::Block::template is_empty<explicit_context>()) {
						continue;
					}
					
					size_t i = 0;	// Offset into block
					if (block == halfDequeuedBlock) {
						i = static_cast<size_t>(this->headIndex.load(std::memory_order_relaxed) & static_cast<index_t>(BLOCK_SIZE - 1));
					}
					
					// Walk through all the items in the block; if this is the tail block, we need to stop when we reach the tail index
					auto lastValidIndex = (this->tailIndex.load(std::memory_order_relaxed) & static_cast<index_t>(BLOCK_SIZE - 1)) == 0 ? BLOCK_SIZE : static_cast<size_t>(this->tailIndex.load(std::memory_order_relaxed) & static_cast<index_t>(BLOCK_SIZE - 1));
					while (i != BLOCK_SIZE && (block != this->tailBlock || i != lastValidIndex)) {
						(*block)[i++]->~T();
					}
				} while (block != this->tailBlock);
			}
			
			// Destroy all blocks that we own
			if (this->tailBlock != nullptr) {
				auto block = this->tailBlock;
				do {
					auto nextBlock = block->next;
					if (block->dynamicallyAllocated) {
						destroy(block);
					}
					else {
						this->parent->add_block_to_free_list(block);
					}
					block = nextBlock;
				} while (block != this->tailBlock);
			}
			
			// Destroy the block indices
			auto header = static_cast<BlockIndexHeader*>(pr_blockIndexRaw);
			while (header != nullptr) {
				auto prev = static_cast<BlockIndexHeader*>(header->prev);
				header->~BlockIndexHeader();
				(Traits::free)(header);
				header = prev;
			}
		}